

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void BIT_flushBits(BIT_CStream_t *bitC)

{
  uint uVar1;
  size_t nbBytes;
  BIT_CStream_t *bitC_local;
  
  uVar1 = bitC->bitPos >> 3;
  if (0x3f < bitC->bitPos) {
    __assert_fail("bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x606,"void BIT_flushBits(BIT_CStream_t *)");
  }
  if (bitC->ptr <= bitC->endPtr) {
    MEM_writeLEST(bitC->ptr,bitC->bitContainer);
    bitC->ptr = bitC->ptr + uVar1;
    if (bitC->endPtr < bitC->ptr) {
      bitC->ptr = bitC->endPtr;
    }
    bitC->bitPos = bitC->bitPos & 7;
    bitC->bitContainer = bitC->bitContainer >> (((byte)uVar1 & 7) << 3);
    return;
  }
  __assert_fail("bitC->ptr <= bitC->endPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    assert(bitC->ptr <= bitC->endPtr);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}